

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scaling.c
# Opt level: O1

c_int scale_data(OSQPWorkspace *work)

{
  double dVar1;
  OSQPScaling *pOVar2;
  long n;
  long n_00;
  c_float *pcVar3;
  c_float *pcVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  c_float cVar8;
  c_float cVar9;
  double dVar10;
  
  pOVar2 = work->scaling;
  n = work->data->n;
  n_00 = work->data->m;
  pOVar2->c = 1.0;
  vec_set_scalar(pOVar2->D,1.0,n);
  vec_set_scalar(work->scaling->Dinv,1.0,work->data->n);
  vec_set_scalar(work->scaling->E,1.0,work->data->m);
  vec_set_scalar(work->scaling->Einv,1.0,work->data->m);
  if (0 < work->settings->scaling) {
    lVar6 = 0;
    do {
      compute_inf_norm_cols_KKT
                (work->data->P,work->data->A,work->D_temp,work->D_temp_A,work->E_temp,n);
      pcVar3 = work->D_temp;
      if (0 < n) {
        lVar5 = 0;
        do {
          uVar7 = -(ulong)(pcVar3[lVar5] < 0.0001);
          dVar1 = (double)(uVar7 & 0x3ff0000000000000 | ~uVar7 & (ulong)pcVar3[lVar5]);
          cVar8 = 10000.0;
          if (dVar1 <= 10000.0) {
            cVar8 = dVar1;
          }
          pcVar3[lVar5] = cVar8;
          lVar5 = lVar5 + 1;
        } while (n != lVar5);
      }
      if (0 < n_00) {
        pcVar4 = work->E_temp;
        lVar5 = 0;
        do {
          dVar1 = pcVar4[lVar5];
          uVar7 = -(ulong)(dVar1 < 0.0001);
          dVar1 = (double)(uVar7 & 0x3ff0000000000000 | ~uVar7 & (ulong)dVar1);
          dVar10 = 10000.0;
          if (dVar1 <= 10000.0) {
            dVar10 = dVar1;
          }
          pcVar4[lVar5] = dVar10;
          lVar5 = lVar5 + 1;
        } while (n_00 != lVar5);
      }
      vec_ew_sqrt(pcVar3,n);
      vec_ew_sqrt(work->E_temp,n_00);
      vec_ew_recipr(work->D_temp,work->D_temp,n);
      vec_ew_recipr(work->E_temp,work->E_temp,n_00);
      mat_premult_diag(work->data->P,work->D_temp);
      mat_postmult_diag(work->data->P,work->D_temp);
      mat_premult_diag(work->data->A,work->E_temp);
      mat_postmult_diag(work->data->A,work->D_temp);
      pcVar3 = work->data->q;
      vec_ew_prod(work->D_temp,pcVar3,pcVar3,n);
      pcVar3 = work->scaling->D;
      vec_ew_prod(pcVar3,work->D_temp,pcVar3,n);
      pcVar3 = work->scaling->E;
      vec_ew_prod(pcVar3,work->E_temp,pcVar3,n_00);
      mat_inf_norm_cols_sym_triu(work->data->P,work->D_temp);
      cVar8 = vec_mean(work->D_temp,n);
      cVar9 = vec_norm_inf(work->data->q,n);
      dVar1 = (double)(-(ulong)(cVar9 < 0.0001) & 0x3ff0000000000000 |
                      ~-(ulong)(cVar9 < 0.0001) & (ulong)cVar9);
      dVar10 = 10000.0;
      if (dVar1 <= 10000.0) {
        dVar10 = dVar1;
      }
      if (cVar8 <= dVar10) {
        cVar8 = dVar10;
      }
      dVar1 = (double)(-(ulong)(cVar8 < 0.0001) & 0x3ff0000000000000 |
                      ~-(ulong)(cVar8 < 0.0001) & (ulong)cVar8);
      dVar10 = 10000.0;
      if (dVar1 <= 10000.0) {
        dVar10 = dVar1;
      }
      dVar10 = 1.0 / dVar10;
      mat_mult_scalar(work->data->P,dVar10);
      vec_mult_scalar(work->data->q,dVar10,n);
      work->scaling->c = dVar10 * work->scaling->c;
      lVar6 = lVar6 + 1;
    } while (lVar6 < work->settings->scaling);
  }
  pOVar2 = work->scaling;
  pOVar2->cinv = 1.0 / pOVar2->c;
  vec_ew_recipr(pOVar2->D,pOVar2->Dinv,work->data->n);
  vec_ew_recipr(work->scaling->E,work->scaling->Einv,work->data->m);
  pcVar3 = work->data->l;
  vec_ew_prod(work->scaling->E,pcVar3,pcVar3,work->data->m);
  pcVar3 = work->data->u;
  vec_ew_prod(work->scaling->E,pcVar3,pcVar3,work->data->m);
  return 0;
}

Assistant:

c_int scale_data(OSQPWorkspace *work) {
  // Scale KKT matrix
  //
  //    [ P   A']
  //    [ A   0 ]
  //
  // with diagonal matrix
  //
  //  S = [ D    ]
  //      [    E ]
  //

  c_int   i;          // Iterations index
  c_int   n, m;       // Number of constraints and variables
  c_float c_temp;     // Cost function scaling
  c_float inf_norm_q; // Infinity norm of q

  n = work->data->n;
  m = work->data->m;

  // Initialize scaling to 1
  work->scaling->c = 1.0;
  vec_set_scalar(work->scaling->D,    1., work->data->n);
  vec_set_scalar(work->scaling->Dinv, 1., work->data->n);
  vec_set_scalar(work->scaling->E,    1., work->data->m);
  vec_set_scalar(work->scaling->Einv, 1., work->data->m);


  for (i = 0; i < work->settings->scaling; i++) {
    //
    // First Ruiz step
    //

    // Compute norm of KKT columns
    compute_inf_norm_cols_KKT(work->data->P, work->data->A,
                              work->D_temp, work->D_temp_A,
                              work->E_temp, n);

    // Set to 1 values with 0 norms (avoid crazy scaling)
    limit_scaling(work->D_temp, n);
    limit_scaling(work->E_temp, m);

    // Take square root of norms
    vec_ew_sqrt(work->D_temp, n);
    vec_ew_sqrt(work->E_temp, m);

    // Divide scalings D and E by themselves
    vec_ew_recipr(work->D_temp, work->D_temp, n);
    vec_ew_recipr(work->E_temp, work->E_temp, m);

    // Equilibrate matrices P and A and vector q
    // P <- DPD
    mat_premult_diag(work->data->P, work->D_temp);
    mat_postmult_diag(work->data->P, work->D_temp);

    // A <- EAD
    mat_premult_diag(work->data->A, work->E_temp);
    mat_postmult_diag(work->data->A, work->D_temp);

    // q <- Dq
    vec_ew_prod(work->D_temp,     work->data->q, work->data->q,    n);

    // Update equilibration matrices D and E
    vec_ew_prod(work->scaling->D, work->D_temp,  work->scaling->D, n);
    vec_ew_prod(work->scaling->E, work->E_temp,  work->scaling->E, m);

    //
    // Cost normalization step
    //

    // Compute avg norm of cols of P
    mat_inf_norm_cols_sym_triu(work->data->P, work->D_temp);
    c_temp = vec_mean(work->D_temp, n);

    // Compute inf norm of q
    inf_norm_q = vec_norm_inf(work->data->q, n);

    // If norm_q == 0, set it to 1 (ignore it in the scaling)
    // NB: Using the same function as with vectors here
    limit_scaling(&inf_norm_q, 1);

    // Compute max between avg norm of cols of P and inf norm of q
    c_temp = c_max(c_temp, inf_norm_q);

    // Limit scaling (use same function as with vectors)
    limit_scaling(&c_temp, 1);

    // Invert scaling c = 1 / cost_measure
    c_temp = 1. / c_temp;

    // Scale P
    mat_mult_scalar(work->data->P, c_temp);

    // Scale q
    vec_mult_scalar(work->data->q, c_temp, n);

    // Update cost scaling
    work->scaling->c *= c_temp;
  }


  // Store cinv, Dinv, Einv
  work->scaling->cinv = 1. / work->scaling->c;
  vec_ew_recipr(work->scaling->D, work->scaling->Dinv, work->data->n);
  vec_ew_recipr(work->scaling->E, work->scaling->Einv, work->data->m);


  // Scale problem vectors l, u
  vec_ew_prod(work->scaling->E, work->data->l, work->data->l, work->data->m);
  vec_ew_prod(work->scaling->E, work->data->u, work->data->u, work->data->m);

  return 0;
}